

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MsgLoopFuture.h
# Opt level: O1

void __thiscall
loop::
Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::set_error(Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *error)

{
  MessageLoop *pMVar1;
  MessageLoop *this_00;
  _Any_data _Stack_68;
  code *local_58;
  _Any_data local_48;
  code *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  do {
  } while ((this->m_lock).super___atomic_base<int>._M_i != 0);
  if ((this->m_failure).second.super__Function_base._M_manager != (_Manager_type)0x0) {
    this_00 = this->m_msgloop;
    pMVar1 = (this->m_failure).first;
    std::
    _Bind<std::function<void(std::shared_ptr<std::pair<int,std::__cxx11::string>>)>(std::shared_ptr<std::pair<int,std::__cxx11::string>>)>
    ::_Bind<std::shared_ptr<std::pair<int,std::__cxx11::string>>&>
              ((_Bind<std::function<void(std::shared_ptr<std::pair<int,std::__cxx11::string>>)>(std::shared_ptr<std::pair<int,std::__cxx11::string>>)>
                *)local_48._M_pod_data,&(this->m_failure).second,error);
    std::function<void()>::
    function<std::_Bind<std::function<void(std::shared_ptr<std::pair<int,std::__cxx11::string>>)>(std::shared_ptr<std::pair<int,std::__cxx11::string>>)>,void>
              ((function<void()> *)_Stack_68._M_pod_data,
               (_Bind<std::function<void_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                *)&local_48);
    if (pMVar1 != (MessageLoop *)0x0) {
      this_00 = pMVar1;
    }
    MessageLoop::post_task(this_00,(Closure *)&_Stack_68);
    if (local_58 != (code *)0x0) {
      (*local_58)(&_Stack_68,&_Stack_68,__destroy_functor);
    }
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  return;
}

Assistant:

void set_error(shared_ptr<T_ERROR> error) {
            while (m_lock != 0) {}
            if (m_failure.second) {
                auto msgloop = m_failure.first ? m_failure.first : m_msgloop;
                msgloop->post_task(std::bind(m_failure.second, error));
            }
        }